

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readwrite.hpp
# Opt level: O0

int __thiscall
libtorrent::aux::
readwrite_impl<char,libtorrent::aux::posix_storage::read(libtorrent::settings_interface_const&,libtorrent::span<char>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,int,libtorrent::storage_error&)::__0>
          (aux *this,file_storage *files,span<char> buf,piece_index_t piece,int offset,
          storage_error *ec,anon_class_8_1_8991fb9c op)

{
  file_index_t file_index_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int64_t iVar4;
  index_type iVar5;
  long lVar6;
  int *piVar7;
  undefined4 in_register_0000008c;
  storage_error *ec_00;
  span<char> sVar8;
  file_storage *local_c8;
  int local_94;
  int bytes_transferred;
  int local_8c;
  int local_88;
  int local_84;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int file_bytes_left;
  int ret;
  int64_t file_offset;
  long lStack_50;
  file_index_t file_index;
  int64_t torrent_offset;
  storage_error *ec_local;
  int offset_local;
  file_storage *files_local;
  anon_class_8_1_8991fb9c op_local;
  undefined1 auStack_20 [4];
  piece_index_t piece_local;
  span<char> buf_local;
  
  ec_00 = (storage_error *)CONCAT44(in_register_0000008c,offset);
  op_local.this._4_4_ = (undefined4)buf.m_len;
  files_local = (file_storage *)ec;
  _auStack_20 = files;
  iVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)((long)&op_local.this + 4));
  iVar3 = file_storage::piece_length((file_storage *)this);
  lStack_50 = (long)iVar2 * (long)iVar3 + (long)piece.m_val;
  file_bytes_left = (int)file_storage::file_index_at_offset((file_storage *)this,lStack_50);
  lVar6 = lStack_50;
  file_offset._4_4_ = (file_index_t)file_bytes_left;
  iVar4 = file_storage::file_offset((file_storage *)this,(file_index_t)file_bytes_left);
  _ret = lVar6 - iVar4;
  local_68 = 0;
  while( true ) {
    iVar5 = span<char>::size((span<char> *)auStack_20);
    if (iVar5 < 1) {
      return local_68;
    }
    iVar5 = span<char>::size((span<char> *)auStack_20);
    local_6c = (int)iVar5;
    lVar6 = _ret + local_6c;
    local_70 = file_offset._4_4_;
    iVar4 = file_storage::file_size((file_storage *)this,file_offset._4_4_);
    if (iVar4 < lVar6) {
      local_78 = file_offset._4_4_;
      iVar4 = file_storage::file_size((file_storage *)this,file_offset._4_4_);
      local_74 = (int)iVar4 - (int)_ret;
      local_7c = 0;
      piVar7 = ::std::max<int>(&local_74,&local_7c);
      local_6c = *piVar7;
    }
    if (local_6c == 0) {
      do {
        strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator++
                  ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                   ((long)&file_offset + 4));
        _ret = 0;
        local_80.m_val = (int)file_storage::end_file((file_storage *)this);
        bVar1 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator>=
                          ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                           ((long)&file_offset + 4),&local_80);
        if (bVar1) {
          return local_68;
        }
        local_84 = file_offset._4_4_;
        iVar4 = file_storage::file_size((file_storage *)this,file_offset._4_4_);
      } while (iVar4 == 0);
      iVar5 = span<char>::size((span<char> *)auStack_20);
      local_6c = (int)iVar5;
      lVar6 = _ret + local_6c;
      local_88 = file_offset._4_4_;
      iVar4 = file_storage::file_size((file_storage *)this,file_offset._4_4_);
      if (iVar4 < lVar6) {
        bytes_transferred = file_offset._4_4_;
        iVar4 = file_storage::file_size((file_storage *)this,file_offset._4_4_);
        local_8c = (int)iVar4 - (int)_ret;
        local_94 = 0;
        piVar7 = ::std::max<int>(&local_8c,&local_94);
        local_6c = *piVar7;
      }
    }
    file_index_00.m_val = file_offset._4_4_;
    iVar4 = _ret;
    sVar8 = span<char>::first((span<char> *)auStack_20,(long)local_6c);
    iVar2 = posix_storage::read::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)&files_local,file_index_00,iVar4,sVar8,ec_00);
    bVar1 = storage_error::operator_cast_to_bool(ec_00);
    if (bVar1) break;
    sVar8 = span<char>::subspan((span<char> *)auStack_20,(long)iVar2);
    local_c8 = (file_storage *)sVar8.m_ptr;
    _auStack_20 = local_c8;
    _ret = iVar2 + _ret;
    local_68 = iVar2 + local_68;
    if ((iVar2 == 0) && (0 < local_6c)) {
      ec_00->operation = file_read;
      boost::system::error_code::operator=((error_code *)ec_00,eof);
      storage_error::file(ec_00,file_offset._4_4_);
    }
  }
  storage_error::file(ec_00,file_offset._4_4_);
  return local_68;
}

Assistant:

int readwrite_impl(file_storage const& files, span<Char> buf
	, piece_index_t const piece, const int offset
	, storage_error& ec, Fun op)
{
	TORRENT_ASSERT(piece >= piece_index_t(0));
	TORRENT_ASSERT(piece < files.end_piece());
	TORRENT_ASSERT(offset >= 0);
	TORRENT_ASSERT(buf.size() > 0);

	TORRENT_ASSERT(buf.size() > 0);
	TORRENT_ASSERT(static_cast<int>(piece) * static_cast<std::int64_t>(files.piece_length())
		+ offset + buf.size() <= files.total_size());

	// find the file iterator and file offset
	std::int64_t const torrent_offset = static_cast<int>(piece) * std::int64_t(files.piece_length()) + offset;
	file_index_t file_index = files.file_index_at_offset(torrent_offset);
	TORRENT_ASSERT(torrent_offset >= files.file_offset(file_index));
	TORRENT_ASSERT(torrent_offset < files.file_offset(file_index) + files.file_size(file_index));
	std::int64_t file_offset = torrent_offset - files.file_offset(file_index);

	int ret = 0;

	while (buf.size() > 0)
	{
		// the number of bytes left to read in the current file (specified by
		// file_index). This is the minimum of (file_size - file_offset) and
		// buf.size().
		int file_bytes_left = int(buf.size());
		if (file_offset + file_bytes_left > files.file_size(file_index))
			file_bytes_left = std::max(static_cast<int>(files.file_size(file_index) - file_offset), 0);

		// there are no bytes left in this file, move to the next one
		// this loop skips over empty files
		if (file_bytes_left == 0)
		{
			do
			{
				++file_index;
				file_offset = 0;
				TORRENT_ASSERT(file_index < files.end_file());

				// this should not happen. buf.size() should be clamped by the total
				// size of the torrent, so we should never run off the end of it
				if (file_index >= files.end_file()) return ret;

				// skip empty files
			}
			while (files.file_size(file_index) == 0);

			file_bytes_left = int(buf.size());
			if (file_offset + file_bytes_left > files.file_size(file_index))
				file_bytes_left = std::max(static_cast<int>(files.file_size(file_index) - file_offset), 0);
			TORRENT_ASSERT(file_bytes_left > 0);
		}

		int const bytes_transferred = op(file_index, file_offset
			, buf.first(file_bytes_left), ec);
		TORRENT_ASSERT(bytes_transferred <= file_bytes_left);
		if (ec)
		{
			ec.file(file_index);
			return ret;
		}

		buf = buf.subspan(bytes_transferred);
		file_offset += bytes_transferred;
		ret += bytes_transferred;

		// if the file operation returned 0, we've hit end-of-file. We're done
		if (bytes_transferred == 0 && file_bytes_left > 0 )
		{
			// fill in this information in case the caller wants to treat
			// a short-read as an error
			ec.operation = operation_t::file_read;
			ec.ec = boost::asio::error::eof;
			ec.file(file_index);
		}
	}
	return ret;
}